

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_sse2.c
# Opt level: O2

uint64_t aom_var_2d_u8_sse2(uint8_t *src,int src_stride,int width,int height)

{
  byte bVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined8 uVar14;
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  uint uVar21;
  long lVar22;
  undefined4 in_register_00000034;
  longlong lVar23;
  long lVar25;
  uint8_t *puVar26;
  long lVar27;
  undefined1 (*pauVar28) [16];
  int iVar29;
  long lVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int iVar33;
  int iVar37;
  int iVar38;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int iVar39;
  undefined1 auVar36 [16];
  __m128i vec_a;
  __m128i vec_a_00;
  __m128i vsrc [8];
  undefined8 auStack_b8 [17];
  uint8_t *puVar24;
  
  lVar23 = CONCAT44(in_register_00000034,src_stride);
  lVar30 = 0;
  lVar27 = 0;
  puVar24 = src;
  puVar26 = src;
  for (lVar25 = 0; lVar25 < width + -0xf; lVar25 = lVar25 + 0x10) {
    pauVar28 = (undefined1 (*) [16])(src + lVar25);
    for (iVar29 = 0; iVar29 < height + -7; iVar29 = iVar29 + 8) {
      for (lVar22 = 0; lVar22 != 0x80; lVar22 = lVar22 + 0x10) {
        uVar14 = *(undefined8 *)(*pauVar28 + 8);
        *(undefined8 *)((long)auStack_b8 + lVar22) = *(undefined8 *)*pauVar28;
        *(undefined8 *)((long)auStack_b8 + lVar22 + 8) = uVar14;
        pauVar28 = (undefined1 (*) [16])(*pauVar28 + src_stride);
      }
      iVar33 = 0;
      iVar37 = 0;
      iVar38 = 0;
      iVar39 = 0;
      for (lVar22 = 0; lVar22 != 0x80; lVar22 = lVar22 + 0x10) {
        auVar32 = *(undefined1 (*) [16])((long)auStack_b8 + lVar22);
        auVar2[0xd] = 0;
        auVar2._0_13_ = auVar32._0_13_;
        auVar2[0xe] = auVar32[7];
        auVar4[0xc] = auVar32[6];
        auVar4._0_12_ = auVar32._0_12_;
        auVar4._13_2_ = auVar2._13_2_;
        auVar6[0xb] = 0;
        auVar6._0_11_ = auVar32._0_11_;
        auVar6._12_3_ = auVar4._12_3_;
        auVar8[10] = auVar32[5];
        auVar8._0_10_ = auVar32._0_10_;
        auVar8._11_4_ = auVar6._11_4_;
        auVar10[9] = 0;
        auVar10._0_9_ = auVar32._0_9_;
        auVar10._10_5_ = auVar8._10_5_;
        auVar12[8] = auVar32[4];
        auVar12._0_8_ = auVar32._0_8_;
        auVar12._9_6_ = auVar10._9_6_;
        auVar15._7_8_ = 0;
        auVar15._0_7_ = auVar12._8_7_;
        auVar17._1_8_ = SUB158(auVar15 << 0x40,7);
        auVar17[0] = auVar32[3];
        auVar17._9_6_ = 0;
        auVar18._1_10_ = SUB1510(auVar17 << 0x30,5);
        auVar18[0] = auVar32[2];
        auVar18._11_4_ = 0;
        auVar34._3_12_ = SUB1512(auVar18 << 0x20,3);
        auVar34[2] = auVar32[1];
        auVar34[0] = auVar32[0];
        auVar34[1] = 0;
        auVar34[0xf] = 0;
        auVar31[1] = 0;
        auVar31[0] = auVar32[8];
        auVar31[2] = auVar32[9];
        auVar31[3] = 0;
        auVar31[4] = auVar32[10];
        auVar31[5] = 0;
        auVar31[6] = auVar32[0xb];
        auVar31[7] = 0;
        auVar31[8] = auVar32[0xc];
        auVar31[9] = 0;
        auVar31[10] = auVar32[0xd];
        auVar31[0xb] = 0;
        auVar31[0xc] = auVar32[0xe];
        auVar31[0xd] = 0;
        auVar31[0xe] = auVar32[0xf];
        auVar31[0xf] = 0;
        auVar35 = pmaddwd(auVar34,auVar34);
        auVar32 = pmaddwd(auVar31,auVar31);
        iVar33 = auVar35._0_4_ + iVar33 + auVar32._0_4_;
        iVar37 = auVar35._4_4_ + iVar37 + auVar32._4_4_;
        iVar38 = auVar35._8_4_ + iVar38 + auVar32._8_4_;
        iVar39 = auVar35._12_4_ + iVar39 + auVar32._12_4_;
      }
      vec_a[1] = lVar23;
      vec_a[0] = (longlong)puVar24;
      uVar21 = mm_accumulate_epi16(vec_a);
      lVar27 = lVar27 + (ulong)uVar21;
      lVar30 = lVar30 + (iVar39 + iVar37 + iVar38 + iVar33);
    }
    iVar33 = 0;
    iVar37 = 0;
    iVar38 = 0;
    iVar39 = 0;
    for (; iVar29 < height; iVar29 = iVar29 + 1) {
      auVar32 = *pauVar28;
      auVar3[0xd] = 0;
      auVar3._0_13_ = auVar32._0_13_;
      auVar3[0xe] = auVar32[7];
      auVar5[0xc] = auVar32[6];
      auVar5._0_12_ = auVar32._0_12_;
      auVar5._13_2_ = auVar3._13_2_;
      auVar7[0xb] = 0;
      auVar7._0_11_ = auVar32._0_11_;
      auVar7._12_3_ = auVar5._12_3_;
      auVar9[10] = auVar32[5];
      auVar9._0_10_ = auVar32._0_10_;
      auVar9._11_4_ = auVar7._11_4_;
      auVar11[9] = 0;
      auVar11._0_9_ = auVar32._0_9_;
      auVar11._10_5_ = auVar9._10_5_;
      auVar13[8] = auVar32[4];
      auVar13._0_8_ = auVar32._0_8_;
      auVar13._9_6_ = auVar11._9_6_;
      auVar16._7_8_ = 0;
      auVar16._0_7_ = auVar13._8_7_;
      auVar19._1_8_ = SUB158(auVar16 << 0x40,7);
      auVar19[0] = auVar32[3];
      auVar19._9_6_ = 0;
      auVar20._1_10_ = SUB1510(auVar19 << 0x30,5);
      auVar20[0] = auVar32[2];
      auVar20._11_4_ = 0;
      auVar36._3_12_ = SUB1512(auVar20 << 0x20,3);
      auVar36[2] = auVar32[1];
      auVar36[0] = auVar32[0];
      auVar36[1] = 0;
      auVar36[0xf] = 0;
      auVar35[1] = 0;
      auVar35[0] = auVar32[8];
      auVar35[2] = auVar32[9];
      auVar35[3] = 0;
      auVar35[4] = auVar32[10];
      auVar35[5] = 0;
      auVar35[6] = auVar32[0xb];
      auVar35[7] = 0;
      auVar35[8] = auVar32[0xc];
      auVar35[9] = 0;
      auVar35[10] = auVar32[0xd];
      auVar35[0xb] = 0;
      auVar35[0xc] = auVar32[0xe];
      auVar35[0xd] = 0;
      auVar35[0xe] = auVar32[0xf];
      auVar35[0xf] = 0;
      auVar36 = pmaddwd(auVar36,auVar36);
      auVar32 = pmaddwd(auVar35,auVar35);
      iVar33 = auVar36._0_4_ + iVar33 + auVar32._0_4_;
      iVar37 = auVar36._4_4_ + iVar37 + auVar32._4_4_;
      iVar38 = auVar36._8_4_ + iVar38 + auVar32._8_4_;
      iVar39 = auVar36._12_4_ + iVar39 + auVar32._12_4_;
      pauVar28 = (undefined1 (*) [16])(*pauVar28 + src_stride);
    }
    vec_a_00[1] = lVar23;
    vec_a_00[0] = (longlong)puVar24;
    uVar21 = mm_accumulate_epi16(vec_a_00);
    lVar27 = lVar27 + (ulong)uVar21;
    lVar30 = lVar30 + (iVar39 + iVar37 + iVar38 + iVar33);
    puVar26 = puVar26 + 0x10;
  }
  iVar29 = 0;
  iVar33 = 0;
  if (0 < height) {
    iVar29 = 0;
    iVar33 = height;
  }
  for (; iVar29 != iVar33; iVar29 = iVar29 + 1) {
    for (lVar22 = 0; lVar25 + lVar22 < (long)width; lVar22 = lVar22 + 1) {
      bVar1 = puVar26[lVar22];
      lVar27 = lVar27 + (ulong)bVar1;
      lVar30 = lVar30 + (ulong)((uint)bVar1 * (uint)bVar1);
    }
    puVar26 = puVar26 + src_stride;
  }
  return lVar30 - (ulong)(lVar27 * lVar27) / (ulong)(long)(height * width);
}

Assistant:

uint64_t aom_var_2d_u8_sse2(uint8_t *src, int src_stride, int width,
                            int height) {
  uint8_t *srcp;
  uint64_t s = 0, ss = 0;
  __m128i vzero = _mm_setzero_si128();
  __m128i v_acc_sum = vzero;
  __m128i v_acc_sqs = vzero;
  int i, j;

  // Process 16 elements in a row
  for (i = 0; i < width - 15; i += 16) {
    srcp = src + i;
    // Process 8 columns at a time
    for (j = 0; j < height - 7; j += 8) {
      __m128i vsrc[8];
      for (int k = 0; k < 8; k++) {
        vsrc[k] = _mm_loadu_si128((__m128i *)srcp);
        srcp += src_stride;
      }
      for (int k = 0; k < 8; k++) {
        __m128i vsrc0 = _mm_unpacklo_epi8(vsrc[k], vzero);
        __m128i vsrc1 = _mm_unpackhi_epi8(vsrc[k], vzero);
        v_acc_sum = _mm_add_epi16(v_acc_sum, vsrc0);
        v_acc_sum = _mm_add_epi16(v_acc_sum, vsrc1);

        __m128i vsqs0 = _mm_madd_epi16(vsrc0, vsrc0);
        __m128i vsqs1 = _mm_madd_epi16(vsrc1, vsrc1);
        v_acc_sqs = _mm_add_epi32(v_acc_sqs, vsqs0);
        v_acc_sqs = _mm_add_epi32(v_acc_sqs, vsqs1);
      }

      // Update total sum and clear the vectors
      s += mm_accumulate_epi16(v_acc_sum);
      ss += mm_accumulate_epi32(v_acc_sqs);
      v_acc_sum = vzero;
      v_acc_sqs = vzero;
    }

    // Process remaining rows (height not a multiple of 8)
    for (; j < height; j++) {
      __m128i vsrc = _mm_loadu_si128((__m128i *)srcp);
      __m128i vsrc0 = _mm_unpacklo_epi8(vsrc, vzero);
      __m128i vsrc1 = _mm_unpackhi_epi8(vsrc, vzero);
      v_acc_sum = _mm_add_epi16(v_acc_sum, vsrc0);
      v_acc_sum = _mm_add_epi16(v_acc_sum, vsrc1);

      __m128i vsqs0 = _mm_madd_epi16(vsrc0, vsrc0);
      __m128i vsqs1 = _mm_madd_epi16(vsrc1, vsrc1);
      v_acc_sqs = _mm_add_epi32(v_acc_sqs, vsqs0);
      v_acc_sqs = _mm_add_epi32(v_acc_sqs, vsqs1);

      srcp += src_stride;
    }

    // Update total sum and clear the vectors
    s += mm_accumulate_epi16(v_acc_sum);
    ss += mm_accumulate_epi32(v_acc_sqs);
    v_acc_sum = vzero;
    v_acc_sqs = vzero;
  }

  // Process the remaining area using C
  srcp = src;
  for (int k = 0; k < height; k++) {
    for (int m = i; m < width; m++) {
      uint8_t val = srcp[m];
      s += val;
      ss += val * val;
    }
    srcp += src_stride;
  }
  return (ss - s * s / (width * height));
}